

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O1

int file_truncate(int handle,LONGLONG filesize)

{
  int iVar1;
  
  iVar1 = fileno((FILE *)handleTable[handle].fileptr);
  ftruncate64(iVar1,filesize);
  iVar1 = fseeko64((FILE *)handleTable[handle].fileptr,filesize,0);
  if (iVar1 == 0) {
    handleTable[handle].currentpos = filesize;
  }
  handleTable[handle].currentpos = filesize;
  handleTable[handle].last_io_op = 0;
  return 0;
}

Assistant:

int file_truncate(int handle, LONGLONG filesize)
/*
  truncate the diskfile to a new smaller size
*/
{

#ifdef HAVE_FTRUNCATE
    int fdesc;

    fdesc = fileno(handleTable[handle].fileptr);
    ftruncate(fdesc, (OFF_T) filesize);
    file_seek(handle, filesize);

    handleTable[handle].currentpos = filesize;
    handleTable[handle].last_io_op = IO_SEEK;

#endif

    return(0);
}